

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_nameLength(ENCODING *enc,char *ptr)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = (int)ptr;
  do {
    bVar1 = *ptr;
    if (bVar1 < 0xdc) {
      bVar2 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
        }
        else {
LAB_006ef7fc:
          bVar2 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar2 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (((byte *)ptr)[1] < 0xfe)) goto LAB_006ef7fc;
      bVar2 = 0;
    }
    if (0x1d < bVar2) goto LAB_006ef831;
    lVar3 = 2;
    if ((0x2f400020U >> (bVar2 & 0x1f) & 1) == 0) {
      if (bVar2 == 6) {
        lVar3 = 3;
      }
      else {
        if (bVar2 != 7) {
LAB_006ef831:
          return (int)ptr - iVar4;
        }
        lVar3 = 4;
      }
    }
    ptr = (char *)((byte *)ptr + lVar3);
  } while( true );
}

Assistant:

PREFIX(nameLength)(const ENCODING *enc, const char *ptr) {
  const char *start = ptr;
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
#  ifdef XML_NS
    case BT_COLON:
#  endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      ptr += MINBPC(enc);
      break;
    default:
      return (int)(ptr - start);
    }
  }
}